

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t string_last_index_of_char(pString str,char sub,size_t start,size_t count)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  
  if ((count <= start + 1) && (uVar1 = str->len, start <= uVar1)) {
    sVar3 = 0xffffffffffffffff;
    if (count != 0) {
      if (uVar1 == start) {
        if (uVar1 == 0) {
          return 0xffffffffffffffff;
        }
        start = start - 1;
        count = count - 1;
      }
      pcVar2 = str->buf;
      pcVar4 = pcVar2 + start;
      pcVar5 = pcVar4 + (1 - count);
      for (; (sVar3 = 0xffffffffffffffff, pcVar5 <= pcVar4 && (sVar3 = start, pcVar2[start] != sub))
          ; start = start - 1) {
        pcVar4 = pcVar2 + (start - 1);
      }
    }
    return sVar3;
  }
  puts("string_last_index_of_char: index out of range");
  exit(1);
}

Assistant:

size_t string_last_index_of_char(pString str, char sub, size_t start, size_t count)
{
    if (start + 1 < count)
    {
        log("string_last_index_of_char: index out of range");
        exit(1);
    }
    if (start > str->len)
    {
        log("string_last_index_of_char: index out of range");
        exit(1);
    }
    if (count == 0)
    {
        return STR_ERROR;
    }
    if (start == str->len)
    {
        if (str->len == 0)
        {
            return STR_ERROR;
        }
        else
        {
            start--;
            count--;
        }
    }

    char *left = str->buf + start - count + 1;
    char *right = str->buf + start - 1 + 1;
    while (left <= right)
    {
        if (*right == sub)
            return right - str->buf;
        right--;
    }
    return STR_ERROR;
}